

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_storage.cpp
# Opt level: O2

void __thiscall
duckdb::LocalTableStorage::LocalTableStorage
          (LocalTableStorage *this,DataTable *new_data_table,LocalTableStorage *parent,
          idx_t drop_column_index)

{
  shared_ptr<duckdb::RowGroupCollection,_true> *this_00;
  pointer puVar1;
  Allocator *pAVar2;
  RowGroupCollection *pRVar3;
  
  (this->super_enable_shared_from_this<duckdb::LocalTableStorage>).__weak_this_.internal.
  super___weak_ptr<duckdb::LocalTableStorage,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->super_enable_shared_from_this<duckdb::LocalTableStorage>).__weak_this_.internal.
  super___weak_ptr<duckdb::LocalTableStorage,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->table_ref)._M_data = new_data_table;
  pAVar2 = Allocator::Get(new_data_table->db);
  this->allocator = pAVar2;
  switchD_014c3389::default(&this->row_groups,0,0x91);
  this->deleted_rows = parent->deleted_rows;
  puVar1 = (parent->optimistic_collections).
           super_vector<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->optimistic_collections).
  super_vector<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (parent->optimistic_collections).
       super_vector<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>_>_>
       .
       super__Vector_base<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->optimistic_collections).
  super_vector<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = puVar1;
  (this->optimistic_collections).
  super_vector<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (parent->optimistic_collections).
       super_vector<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>_>_>
       .
       super__Vector_base<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (parent->optimistic_collections).
  super_vector<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (parent->optimistic_collections).
  super_vector<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (parent->optimistic_collections).
  super_vector<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  OptimisticDataWriter::OptimisticDataWriter
            (&this->optimistic_writer,new_data_table,&parent->optimistic_writer);
  this->merged_storage = parent->merged_storage;
  this->is_dropped = false;
  (this->collections_lock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->collections_lock).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->collections_lock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->collections_lock).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->collections_lock).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  this_00 = &parent->row_groups;
  pRVar3 = shared_ptr<duckdb::RowGroupCollection,_true>::operator->(this_00);
  RowGroupCollection::RemoveColumn((RowGroupCollection *)&stack0xffffffffffffffc0,(idx_t)pRVar3);
  shared_ptr<duckdb::RowGroupCollection,_true>::operator=
            (&this->row_groups,
             (shared_ptr<duckdb::RowGroupCollection,_true> *)&stack0xffffffffffffffc0);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc8);
  pRVar3 = shared_ptr<duckdb::RowGroupCollection,_true>::operator->(this_00);
  RowGroupCollection::CommitDropColumn(pRVar3,drop_column_index);
  ::std::__shared_ptr<duckdb::RowGroupCollection,_(__gnu_cxx::_Lock_policy)2>::reset
            ((__shared_ptr<duckdb::RowGroupCollection,_(__gnu_cxx::_Lock_policy)2> *)this_00);
  ::std::
  vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
  ::_M_move_assign(&(this->append_indexes).indexes.
                    super_vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
                   ,&(parent->append_indexes).indexes);
  return;
}

Assistant:

LocalTableStorage::LocalTableStorage(DataTable &new_data_table, LocalTableStorage &parent,
                                     const idx_t drop_column_index)
    : table_ref(new_data_table), allocator(Allocator::Get(new_data_table.db)), deleted_rows(parent.deleted_rows),
      optimistic_collections(std::move(parent.optimistic_collections)),
      optimistic_writer(new_data_table, parent.optimistic_writer), merged_storage(parent.merged_storage) {

	// Remove the column from the previous table storage.
	row_groups = parent.row_groups->RemoveColumn(drop_column_index);
	parent.row_groups->CommitDropColumn(drop_column_index);
	parent.row_groups.reset();

	append_indexes.Move(parent.append_indexes);
}